

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TStokesAnalytic::Duxy<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZFMatrix<Fad<double>_> *Du)

{
  Fad<double> *this_00;
  Fad<double> *in_RDI;
  int j;
  int i;
  TPZFMatrix<Fad<double>_> gradT;
  TPZFMatrix<Fad<double>_> grad;
  Fad<double> *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
  *fadexpr;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe30;
  Fad<double> *in_stack_fffffffffffffe40;
  Fad<double> *in_stack_fffffffffffffe48;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe50;
  double in_stack_fffffffffffffe58;
  int local_1a0;
  int local_19c;
  Fad<double> *in_stack_fffffffffffffe98;
  int64_t in_stack_fffffffffffffea0;
  int64_t in_stack_fffffffffffffea8;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffeb0;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
  local_c8 [6];
  
  fadexpr = local_c8;
  Fad<double>::Fad<double,_nullptr>(in_RDI,in_stack_fffffffffffffe18);
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98);
  Fad<double>::~Fad(in_stack_fffffffffffffe10);
  Fad<double>::Fad<double,_nullptr>(in_RDI,in_stack_fffffffffffffe18);
  TPZFMatrix<Fad<double>_>::TPZFMatrix
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98);
  Fad<double>::~Fad(in_stack_fffffffffffffe10);
  graduxy<Fad<double>>
            ((TStokesAnalytic *)gradT.fWork.fStore,(TPZVec<Fad<double>_> *)gradT.fWork._vptr_TPZVec,
             (TPZFMatrix<Fad<double>_> *)gradT.fPivot._48_8_);
  TPZFMatrix<Fad<double>_>::Transpose
            (in_stack_fffffffffffffe50,(TPZMatrix<Fad<double>_> *)in_stack_fffffffffffffe48);
  for (local_19c = 0; local_19c < 3; local_19c = local_19c + 1) {
    for (local_1a0 = 0; local_1a0 < 3; local_1a0 = local_1a0 + 1) {
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffffe30,(int64_t)fadexpr,(int64_t)in_RDI);
      this_00 = TPZFMatrix<Fad<double>_>::operator()
                          (in_stack_fffffffffffffe30,(int64_t)fadexpr,(int64_t)in_RDI);
      operator+<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      operator*<double,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_nullptr>
                (in_stack_fffffffffffffe58,
                 (FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe50);
      TPZFMatrix<Fad<double>_>::operator()
                (in_stack_fffffffffffffe30,(int64_t)fadexpr,(int64_t)in_RDI);
      Fad<double>::operator=((Fad<double> *)in_stack_fffffffffffffe30,fadexpr);
      FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>::
      ~FadExpr((FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>
                *)this_00);
      FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *)this_00);
    }
  }
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x1f0dd07);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)0x1f0dd14);
  return;
}

Assistant:

void TStokesAnalytic::Duxy(const TPZVec<TVar> &x, TPZFMatrix<TVar> &Du) const
{
    TPZFMatrix<TVar> grad(3,3,0.), gradT(3,3,0.);
    graduxy(x,grad);
    grad.Transpose(&gradT);
    for(int i=0; i<3; i++)
    {
        for(int j=0; j<3; j++)
        {
            Du(i,j) = 0.5*(grad(i,j)+gradT(i,j));
        }
    }
}